

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::isMatrix(QPDFObjectHandle *this)

{
  bool bVar1;
  int iVar2;
  pair<bool,_QPDFObjectHandle> local_68;
  undefined1 local_50 [8];
  QPDFObjectHandle item;
  int i;
  undefined1 local_30 [8];
  Array array;
  QPDFObjectHandle *this_local;
  
  array.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                    )this;
  as_array((Array *)local_30,this,strict);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_30);
  if (bVar1) {
    for (item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._0_4_ = 0;
        (int)item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi < 6;
        item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_4_ =
             (int)item.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1)
    {
      ::qpdf::Array::at(&local_68,(Array *)local_30,
                        (int)item.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
      QPDFObjectHandle((QPDFObjectHandle *)local_50,&local_68.second);
      std::pair<bool,_QPDFObjectHandle>::~pair(&local_68);
      bVar1 = isNumber((QPDFObjectHandle *)local_50);
      if (!bVar1) {
        this_local._7_1_ = 0;
      }
      bVar1 = !bVar1;
      ~QPDFObjectHandle((QPDFObjectHandle *)local_50);
      if (bVar1) goto LAB_0032be30;
    }
    iVar2 = ::qpdf::Array::size((Array *)local_30);
    this_local._7_1_ = iVar2 == 6;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
LAB_0032be30:
  ::qpdf::Array::~Array((Array *)local_30);
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFObjectHandle::isMatrix() const
{
    if (auto array = as_array(strict)) {
        for (int i = 0; i < 6; ++i) {
            if (auto item = array.at(i).second; !item.isNumber()) {
                return false;
            }
        }
        return array.size() == 6;
    }
    return false;
}